

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_istype(lua_State *L)

{
  CTState *cts_00;
  CTypeID id;
  TValue *pTVar1;
  ulong uVar2;
  CType *d;
  CTypeID local_a4;
  CType *ct2;
  CType *ct1;
  CTypeID id2;
  GCcdata *cd;
  int b;
  TValue *o;
  CTypeID id1;
  CTState *cts;
  lua_State *L_local;
  CTState *cts_1;
  CType *local_48;
  
  cts_00 = *(CTState **)((L->glref).ptr64 + 0x180);
  cts_00->L = L;
  id = ffi_checkctype(L,cts_00,(TValue *)0x0);
  pTVar1 = lj_lib_checkany(L,2);
  cd._4_4_ = 0;
  if ((int)(pTVar1->field_4).it >> 0xf == -0xb) {
    uVar2 = pTVar1->u64 & 0x7fffffffffff;
    if (*(short *)(uVar2 + 10) == 0x16) {
      local_a4 = *(CTypeID *)(uVar2 + 0x10);
    }
    else {
      local_a4 = (CTypeID)*(ushort *)(uVar2 + 10);
    }
    d = lj_ctype_rawref(cts_00,id);
    local_48 = lj_ctype_rawref(cts_00,local_a4);
    if (d == local_48) {
      cd._4_4_ = 1;
    }
    else if ((d->info >> 0x1c == local_48->info >> 0x1c) && (d->size == local_48->size)) {
      if (d->info >> 0x1d == 1) {
        cd._4_4_ = lj_cconv_compatptr(cts_00,d,local_48,8);
      }
      else if ((d->info >> 0x1c == 0) || (d->info >> 0x1c == 4)) {
        cd._4_4_ = (uint)(((d->info ^ local_48->info) & 0xfcbfffff) == 0);
      }
    }
    else if ((d->info >> 0x1c == 1) && (local_48->info >> 0x1c == 2)) {
      do {
        local_48 = cts_00->tab + (local_48->info & 0xffff);
      } while (local_48->info >> 0x1c == 8);
      if (d == local_48) {
        cd._4_4_ = 1;
      }
    }
  }
  L->top[-1].u64 = (long)(int)(cd._4_4_ + 1) << 0x2f ^ 0xffffffffffffffff;
  *(ulong *)((L->glref).ptr64 + 0xf0) = (long)(int)(cd._4_4_ + 1) << 0x2f ^ 0xffffffffffffffff;
  return 1;
}

Assistant:

LJLIB_CF(ffi_istype)	LJLIB_REC(.)
{
  CTState *cts = ctype_cts(L);
  CTypeID id1 = ffi_checkctype(L, cts, NULL);
  TValue *o = lj_lib_checkany(L, 2);
  int b = 0;
  if (tviscdata(o)) {
    GCcdata *cd = cdataV(o);
    CTypeID id2 = cd->ctypeid == CTID_CTYPEID ? *(CTypeID *)cdataptr(cd) :
						cd->ctypeid;
    CType *ct1 = lj_ctype_rawref(cts, id1);
    CType *ct2 = lj_ctype_rawref(cts, id2);
    if (ct1 == ct2) {
      b = 1;
    } else if (ctype_type(ct1->info) == ctype_type(ct2->info) &&
	       ct1->size == ct2->size) {
      if (ctype_ispointer(ct1->info))
	b = lj_cconv_compatptr(cts, ct1, ct2, CCF_IGNQUAL);
      else if (ctype_isnum(ct1->info) || ctype_isvoid(ct1->info))
	b = (((ct1->info ^ ct2->info) & ~(CTF_QUAL|CTF_LONG)) == 0);
    } else if (ctype_isstruct(ct1->info) && ctype_isptr(ct2->info) &&
	       ct1 == ctype_rawchild(cts, ct2)) {
      b = 1;
    }
  }
  setboolV(L->top-1, b);
  setboolV(&G(L)->tmptv2, b);  /* Remember for trace recorder. */
  return 1;
}